

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int AddToPartition(ON_Mesh *mesh,ON_SimpleArray<int> *pmark,int vi,int partition_mark,int fi0)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ON_MeshFace *pOVar4;
  int *fvi;
  int face_count;
  int new_vi;
  int fi;
  int i;
  int iStack_20;
  bool b;
  int fi0_local;
  int partition_mark_local;
  int vi_local;
  ON_SimpleArray<int> *pmark_local;
  ON_Mesh *mesh_local;
  
  fi._3_1_ = 1;
  iStack_20 = partition_mark;
  fi0_local = vi;
  _partition_mark_local = pmark;
  pmark_local = (ON_SimpleArray<int> *)mesh;
  piVar3 = ON_SimpleArray<int>::operator[](pmark,vi);
  iVar2 = iStack_20;
  iVar1 = *piVar3;
  if (iVar1 == 0) {
    piVar3 = ON_SimpleArray<int>::operator[](_partition_mark_local,fi0_local);
    *piVar3 = iVar2;
  }
  else if ((iVar1 == iStack_20) || (iVar1 == iStack_20 + -1)) {
    fi._3_1_ = 0;
  }
  else if (iVar1 == iStack_20 + -2) {
    iVar1 = iStack_20 + -1;
    piVar3 = ON_SimpleArray<int>::operator[](_partition_mark_local,fi0_local);
    *piVar3 = iVar1;
  }
  else {
    iVar1 = DupVertex((ON_Mesh *)pmark_local,fi0_local);
    iVar2 = ON_SimpleArray<ON_MeshFace>::Count
                      ((ON_SimpleArray<ON_MeshFace> *)&pmark_local[2].m_count);
    for (face_count = fi0; face_count < iVar2; face_count = face_count + 1) {
      pOVar4 = ON_SimpleArray<ON_MeshFace>::operator[]
                         ((ON_SimpleArray<ON_MeshFace> *)&pmark_local[2].m_count,face_count);
      if (pOVar4->vi[0] == fi0_local) {
        pOVar4->vi[0] = iVar1;
      }
      if (pOVar4->vi[1] == fi0_local) {
        pOVar4->vi[1] = iVar1;
      }
      if (pOVar4->vi[2] == fi0_local) {
        pOVar4->vi[2] = iVar1;
      }
      if (pOVar4->vi[3] == fi0_local) {
        pOVar4->vi[3] = iVar1;
      }
    }
    ON_SimpleArray<int>::Append(_partition_mark_local,&stack0xffffffffffffffe0);
  }
  return (int)fi._3_1_;
}

Assistant:

static int AddToPartition( ON_Mesh* mesh, ON_SimpleArray<int>& pmark, int vi, int partition_mark, int fi0 )
{
  bool b = true;
  int i, fi, new_vi, face_count, *fvi;
  i = pmark[vi];
  if ( !i ) {
    pmark[vi] = partition_mark;
  }
  else if ( i != partition_mark && i != partition_mark-1 ) {
    if ( i == partition_mark-2 )
      pmark[vi] = partition_mark-1; // vertex vi shared between two partitions
    else {
      new_vi = DupVertex(mesh,vi);
      face_count = mesh->m_F.Count();
      for ( fi = fi0; fi < face_count; fi++ ) {
        fvi = mesh->m_F[fi].vi;
        if ( fvi[0] == vi )
          fvi[0] = new_vi;
        if ( fvi[1] == vi )
          fvi[1] = new_vi;
        if ( fvi[2] == vi )
          fvi[2] = new_vi;
        if ( fvi[3] == vi )
          fvi[3] = new_vi;
      }
      pmark.Append(partition_mark);
    }
  }
  else
    b = false; // vertex already in this partition
  return b;
}